

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O2

void generateAsm<true>(uint32_t nonce)

{
  long lVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint64_t hash [8];
  uint8_t blockTemplate [76];
  AssemblyGeneratorX86 asmX86;
  Program p;
  uint8_t scratchpad [262144];
  
  puVar2 = blockTemplate_;
  puVar3 = blockTemplate;
  for (lVar1 = 0x4c; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    puVar3 = puVar3 + 1;
  }
  blockTemplate._39_4_ = nonce;
  blake2b(hash,0x40,blockTemplate,0x4c,(void *)0x0,0);
  fillAes1Rx4<true>(hash,0x40000,scratchpad);
  std::__cxx11::stringstream::stringstream((stringstream *)&asmX86);
  fillAes4Rx4<true>(hash,0x280,&p);
  defyx::AssemblyGeneratorX86::generateProgram(&asmX86,&p);
  std::ostream::operator<<(&std::cout,(streambuf *)&asmX86.field_0x18);
  std::__cxx11::stringstream::~stringstream((stringstream *)&asmX86);
  return;
}

Assistant:

void generateAsm(uint32_t nonce) {
	alignas(16) uint64_t hash[8];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	store32(blockTemplate + 39, nonce);
	blake2b(hash, sizeof(hash), blockTemplate, sizeof(blockTemplate), nullptr, 0);
	uint8_t scratchpad[defyx::ScratchpadSize];
	fillAes1Rx4<softAes>((void*)hash, defyx::ScratchpadSize, scratchpad);
	defyx::AssemblyGeneratorX86 asmX86;
	defyx::Program p;
	fillAes4Rx4<softAes>(hash, sizeof(p), &p);
	asmX86.generateProgram(p);
	asmX86.printCode(std::cout);
}